

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall Catch::Config::readBazelEnvVars(Config *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  uint uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  char cVar4;
  char *pcVar5;
  char *__s;
  char *__s_00;
  uint *puVar6;
  ostream *poVar7;
  bazelShardingOptions *pbVar8;
  ReporterSpec *in_RSI;
  allocator<char> local_2f9;
  Optional<Catch::(anonymous_namespace)::bazelShardingOptions> bazelShardOptions;
  Optional<unsigned_int> local_2c8;
  Optional<unsigned_int> local_2b8;
  Optional<Catch::ColourMode> local_2a8;
  string local_298;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_278;
  Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_248;
  ofstream f;
  char *local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_200;
  
  pcVar5 = getenv("XML_OUTPUT_FILE");
  if (pcVar5 != (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_298,"junit",(allocator<char> *)&local_2b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&bazelShardOptions,pcVar5,(allocator<char> *)&local_2c8);
    Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    Optional(&local_248,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bazelShardOptions
            );
    local_2a8.nullableValue = (ColourMode *)0x0;
    local_278._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_278._M_impl.super__Rb_tree_header._M_header;
    local_278._M_impl._0_8_ = 0;
    local_278._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_278._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_278._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_278._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_278._M_impl.super__Rb_tree_header._M_header._M_right =
         local_278._M_impl.super__Rb_tree_header._M_header._M_left;
    ReporterSpec::ReporterSpec
              ((ReporterSpec *)&f,&local_298,&local_248,&local_2a8,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&local_278);
    in_RSI = (ReporterSpec *)&f;
    std::vector<Catch::ReporterSpec,_std::allocator<Catch::ReporterSpec>_>::
    emplace_back<Catch::ReporterSpec>(&(this->m_data).reporterSpecifications,in_RSI);
    ReporterSpec::~ReporterSpec((ReporterSpec *)&f);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_278);
    local_2a8.nullableValue = (ColourMode *)0x0;
    Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_248);
    std::__cxx11::string::~string((string *)&bazelShardOptions);
    std::__cxx11::string::~string((string *)&local_298);
  }
  pcVar5 = getenv("TESTBRIDGE_TEST_ONLY");
  if (pcVar5 != (char *)0x0) {
    this_00 = &(this->m_data).testsOrTags;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(this_00);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&f,pcVar5,(allocator<char> *)&bazelShardOptions);
    in_RSI = (ReporterSpec *)&f;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RSI);
    std::__cxx11::string::~string((string *)&f);
  }
  pcVar5 = getenv("TEST_SHARD_INDEX");
  __s = getenv("TEST_TOTAL_SHARDS");
  __s_00 = getenv("TEST_SHARD_STATUS_FILE");
  if (((pcVar5 == (char *)0x0) || (__s == (char *)0x0)) || (__s_00 == (char *)0x0)) {
    if (pcVar5 == (char *)0x0) {
      anon_unknown_26::readBazelShardingOptions::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)"TEST_SHARD_INDEX",(char *)in_RSI);
    }
    if (__s == (char *)0x0) {
      anon_unknown_26::readBazelShardingOptions::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)"TEST_TOTAL_SHARDS",(char *)in_RSI);
    }
    if (__s_00 == (char *)0x0) {
      anon_unknown_26::readBazelShardingOptions::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)"TEST_SHARD_STATUS_FILE",(char *)in_RSI);
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&f,pcVar5,(allocator<char> *)&local_2c8);
    parseUInt((Catch *)&local_2b8,(string *)&f,10);
    std::__cxx11::string::~string((string *)&f);
    if (local_2b8.nullableValue == (uint *)0x0) {
      poVar7 = std::operator<<((ostream *)&std::cerr,
                               "Warning: could not parse \'TEST_SHARD_INDEX\' (\'");
      poVar7 = std::operator<<(poVar7,pcVar5);
      std::operator<<(poVar7,"\') as unsigned int.\n");
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&f,__s,&local_2f9);
      parseUInt((Catch *)&local_2c8,(string *)&f,10);
      std::__cxx11::string::~string((string *)&f);
      if (local_2c8.nullableValue != (uint *)0x0) {
        puVar6 = Optional<unsigned_int>::operator*(&local_2b8);
        _f = *puVar6;
        puVar6 = Optional<unsigned_int>::operator*(&local_2c8);
        uVar1 = *puVar6;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,__s_00,&local_2f9);
        uVar2 = local_210._M_allocated_capacity;
        bazelShardOptions.nullableValue = (bazelShardingOptions *)bazelShardOptions.storage;
        bazelShardOptions.storage._4_4_ = uVar1;
        bazelShardOptions.storage._0_4_ = _f;
        bazelShardOptions.storage._8_8_ = bazelShardOptions.storage + 0x18;
        if (local_218 == local_210._M_local_buf + 8) {
          bazelShardOptions.storage._32_8_ = pbStack_200;
        }
        else {
          bazelShardOptions.storage._8_8_ = local_218;
        }
        local_210._M_allocated_capacity = 0;
        uVar3 = local_210._M_allocated_capacity;
        local_210._M_local_buf[0] = (char)uVar2;
        local_210._M_local_buf[1] = SUB81(uVar2,1);
        local_210._M_local_buf[2] = SUB81(uVar2,2);
        local_210._M_local_buf[3] = SUB81(uVar2,3);
        local_210._M_local_buf[4] = SUB81(uVar2,4);
        local_210._M_local_buf[5] = SUB81(uVar2,5);
        local_210._M_local_buf[6] = SUB81(uVar2,6);
        local_210._M_local_buf[7] = SUB81(uVar2,7);
        bazelShardOptions.storage[0x10] = local_210._M_local_buf[0];
        bazelShardOptions.storage[0x11] = local_210._M_local_buf[1];
        bazelShardOptions.storage[0x12] = local_210._M_local_buf[2];
        bazelShardOptions.storage[0x13] = local_210._M_local_buf[3];
        bazelShardOptions.storage[0x14] = local_210._M_local_buf[4];
        bazelShardOptions.storage[0x15] = local_210._M_local_buf[5];
        bazelShardOptions.storage[0x16] = local_210._M_local_buf[6];
        bazelShardOptions.storage[0x17] = local_210._M_local_buf[7];
        local_210._M_local_buf[8] = '\0';
        local_218 = local_210._M_local_buf + 8;
        local_210._M_allocated_capacity = uVar3;
        std::__cxx11::string::~string((string *)&local_218);
        if (bazelShardOptions.nullableValue != (bazelShardingOptions *)0x0) {
          pbVar8 = Optional<Catch::(anonymous_namespace)::bazelShardingOptions>::operator->
                             (&bazelShardOptions);
          std::ofstream::ofstream(&f,(string *)&pbVar8->shardFilePath,_S_trunc|_S_out);
          cVar4 = std::__basic_file<char>::is_open();
          if (cVar4 != '\0') {
            std::operator<<((ostream *)&f,"");
            pbVar8 = Optional<Catch::(anonymous_namespace)::bazelShardingOptions>::operator->
                               (&bazelShardOptions);
            (this->m_data).shardIndex = pbVar8->shardIndex;
            pbVar8 = Optional<Catch::(anonymous_namespace)::bazelShardingOptions>::operator->
                               (&bazelShardOptions);
            (this->m_data).shardCount = pbVar8->shardCount;
          }
          std::ofstream::~ofstream(&f);
        }
        goto LAB_00149615;
      }
      poVar7 = std::operator<<((ostream *)&std::cerr,
                               "Warning: could not parse \'TEST_TOTAL_SHARD\' (\'");
      poVar7 = std::operator<<(poVar7,__s);
      std::operator<<(poVar7,"\') as unsigned int.\n");
    }
  }
  bazelShardOptions.nullableValue = (bazelShardingOptions *)0x0;
LAB_00149615:
  Optional<Catch::(anonymous_namespace)::bazelShardingOptions>::~Optional(&bazelShardOptions);
  return;
}

Assistant:

void Config::readBazelEnvVars() {
        // Register a JUnit reporter for Bazel. Bazel sets an environment
        // variable with the path to XML output. If this file is written to
        // during test, Bazel will not generate a default XML output.
        // This allows the XML output file to contain higher level of detail
        // than what is possible otherwise.
        const auto bazelOutputFile = Detail::getEnv( "XML_OUTPUT_FILE" );

        if ( bazelOutputFile ) {
            m_data.reporterSpecifications.push_back(
                { "junit", std::string( bazelOutputFile ), {}, {} } );
        }

        const auto bazelTestSpec = Detail::getEnv( "TESTBRIDGE_TEST_ONLY" );
        if ( bazelTestSpec ) {
            // Presumably the test spec from environment should overwrite
            // the one we got from CLI (if we got any)
            m_data.testsOrTags.clear();
            m_data.testsOrTags.push_back( bazelTestSpec );
        }

        const auto bazelShardOptions = readBazelShardingOptions();
        if ( bazelShardOptions ) {
            std::ofstream f( bazelShardOptions->shardFilePath,
                             std::ios_base::out | std::ios_base::trunc );
            if ( f.is_open() ) {
                f << "";
                m_data.shardIndex = bazelShardOptions->shardIndex;
                m_data.shardCount = bazelShardOptions->shardCount;
            }
        }
    }